

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall adios2::transport::FileFStream::FileFStream(FileFStream *this,Comm *comm)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"File",&local_51);
  std::__cxx11::string::string((string *)&local_50,"fstream",&local_52);
  Transport::Transport(&this->super_Transport,&local_30,&local_50,comm);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__FileFStream_008236a0;
  std::fstream::fstream(&this->m_FileStream);
  this->m_IsOpening = false;
  (this->m_OpenFuture).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_OpenFuture).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

FileFStream::FileFStream(helper::Comm const &comm) : Transport("File", "fstream", comm) {}